

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

int tele(char *msg)

{
  monst *pmVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  coord cc;
  char buf [256];
  coord local_13a;
  char local_138 [264];
  
  if ((((level->flags).field_0x9 & 8) != 0) && (flags.debug == '\0')) {
    pcVar5 = "A mysterious force prevents you from teleporting!";
LAB_0025a6b5:
    pline(pcVar5);
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    make_blinded(0,'\0');
  }
  if (((((u.uhave._0_1_ & 1) != 0) || (bVar2 = On_W_tower_level(&u.uz), bVar2 != '\0')) ||
      ((u.usteed != (monst *)0x0 && (iVar4 = mon_has_amulet(u.usteed), iVar4 != 0)))) &&
     (flags.debug == '\0')) {
    pcVar5 = "You feel disoriented for a moment.";
    goto LAB_0025a6b5;
  }
  if (((((u.uprops[0xf].extrinsic != 0 || u.uprops[0xf].intrinsic != 0) ||
        (((youmonst.data)->mflags1 & 0x4000000) != 0)) && (u.uprops[0x1b].intrinsic == 0)) &&
      ((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')))) || (flags.debug != '\0')) {
    bVar2 = unconscious();
    if (bVar2 == '\0') {
      if (u.usteed != (monst *)0x0) {
        pcVar5 = mon_nam(u.usteed);
        sprintf(local_138," and %s",pcVar5);
      }
      pline("To what position do you%s want to be teleported?");
      local_13a.x = u.ux;
      local_13a.y = u.uy;
      iVar4 = getpos(&local_13a,'\0',"the desired position");
      if (iVar4 < 0) {
        return 0;
      }
      bVar2 = teleok((int)local_13a.x,(int)local_13a.y,'\0');
      if (bVar2 != '\0') {
LAB_0025a7b1:
        teleds((int)local_13a.x,(int)local_13a.y,'\0');
        return 1;
      }
      if (flags.debug != '\0') {
        pcVar5 = "Force teleport?";
        if ((((byte)local_13a.y < 0x15 && (byte)(local_13a.x - 1U) < 0x4f) &&
            (pmVar1 = level->monsters[(byte)local_13a.x][(byte)local_13a.y], pmVar1 != (monst *)0x0)
            ) && (pcVar5 = "Force teleport?", (pmVar1->field_0x61 & 2) == 0)) {
          pcVar5 = "Force teleport? (monster blocking)";
        }
        cVar3 = yn_function(pcVar5,"yn",'n');
        if (cVar3 == 'y') goto LAB_0025a7b1;
      }
      pcVar5 = "Sorry...";
    }
    else {
      pcVar5 = "Being unconscious, you cannot control your teleport.";
    }
    pline(pcVar5);
  }
  local_13a.x = u.ux;
  local_13a.y = u.uy;
  safe_teleds('\0');
  if ((u.ux == local_13a.x) && (u.uy == local_13a.y)) {
    return 1;
  }
  if (msg != (char *)0x0) {
    if (*msg == '\0') {
      return 1;
    }
    goto LAB_0025a7f4;
  }
  if (flags.verbose == '\0') {
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025a6fa;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025a6f5;
  }
  else {
LAB_0025a6f5:
    if (ublindf == (obj *)0x0) goto LAB_0025a704;
LAB_0025a6fa:
    if (ublindf->oartifact != '\x1d') {
LAB_0025a704:
      pcVar5 = surface((int)local_13a.x,(int)local_13a.y);
      pline("The %s under you seems different from before.",pcVar5);
      return 1;
    }
  }
  msg = "Your surroundings suddenly seem different.";
LAB_0025a7f4:
  pline(msg);
  return 1;
}

Assistant:

int tele(const char *msg)
{
	coord cc;

	/* Disable teleportation in stronghold && Vlad's Tower */
	if (level->flags.noteleport) {
		if (!wizard) {
		    pline("A mysterious force prevents you from teleporting!");
		    return 1;
		}
	}

	/* don't show trap if "Sorry..." */
	if (!Blinded) make_blinded(0L,FALSE);

	if ((u.uhave.amulet || On_W_tower_level(&u.uz) ||
	     (u.usteed && mon_has_amulet(u.usteed))) &&
	    !wizard) {
	    pline("You feel disoriented for a moment.");
	    return 1;
	}
	if ((Teleport_control && !Stunned) || wizard) {
	    if (unconscious()) {
		pline("Being unconscious, you cannot control your teleport.");
	    } else {
		    char buf[BUFSZ];
		    if (u.usteed)
			    sprintf(buf," and %s", mon_nam(u.usteed));
		    pline("To what position do you%s want to be teleported?",
				u.usteed ? buf : "");
		    cc.x = u.ux;
		    cc.y = u.uy;
		    if (getpos(&cc, FALSE, "the desired position") < 0)
			return 0;	/* abort */
		    /* possible extensions: introduce a small error if
		       magic power is low; allow transfer to solid rock */
		    if (teleok(cc.x, cc.y, FALSE) ||
			(wizard &&
			 yn((isok(cc.x, cc.y) && m_at(level, cc.x, cc.y)) ?
			    "Force teleport? (monster blocking)" :
			    "Force teleport?") == 'y')) {
			teleds(cc.x, cc.y, FALSE);
			return 1;
		    }
		    pline("Sorry...");
		}
	}

	cc.x = u.ux;
	cc.y = u.uy;
	safe_teleds(FALSE);
	if (u.ux != cc.x || u.uy != cc.y) {
	    if (msg == NULL) {
		if (flags.verbose) {
		    if (Blind) {
			pline("The %s under you seems different from before.",
			      surface(cc.x, cc.y));
		    } else {
			pline("Your surroundings suddenly seem different.");
		    }
		}
	    } else if (msg[0] != '\0') {
		pline(msg);
	    }
	}
	return 1;
}